

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intM114.c
# Opt level: O0

int Inter_ManPerformOneStep(Inter_Man_t *p,int fUseBias,int fUseBackward,abctime nTimeNewOut)

{
  int iVar1;
  sat_solver *s;
  int *__ptr;
  abctime aVar2;
  abctime aVar3;
  Inta_Man_t *p_00;
  Aig_Man_t *pAVar4;
  int *local_70;
  abctime clk;
  int Var;
  int i;
  int RetValue;
  int status;
  int *pGlobalVars;
  Inta_Man_t *pManInterA;
  void *pSatCnf;
  sat_solver *pSat;
  abctime nTimeNewOut_local;
  int fUseBackward_local;
  int fUseBias_local;
  Inter_Man_t *p_local;
  
  pManInterA = (Inta_Man_t *)0x0;
  s = Inter_ManDeriveSatSolver
                (p->pInter,p->pCnfInter,p->pAigTrans,p->pCnfAig,p->pFrames,p->pCnfFrames,p->vVarsAB,
                 fUseBackward);
  if (s == (sat_solver *)0x0) {
    p->pInterNew = (Aig_Man_t *)0x0;
    p_local._4_4_ = 1;
  }
  else {
    if (nTimeNewOut != 0) {
      sat_solver_set_runtime_limit(s,nTimeNewOut);
    }
    iVar1 = sat_solver_nvars(s);
    __ptr = (int *)calloc((long)iVar1,4);
    for (clk._4_4_ = 0; iVar1 = Vec_IntSize(p->vVarsAB), clk._4_4_ < iVar1;
        clk._4_4_ = clk._4_4_ + 1) {
      iVar1 = Vec_IntEntry(p->vVarsAB,clk._4_4_);
      __ptr[iVar1] = 1;
    }
    local_70 = __ptr;
    if (fUseBias == 0) {
      local_70 = (int *)0x0;
    }
    s->pGlobalVars = local_70;
    aVar2 = Abc_Clock();
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)p->nConfLimit,0,0,0);
    p->nConfCur = (int)(s->stats).conflicts;
    aVar3 = Abc_Clock();
    p->timeSat = (aVar3 - aVar2) + p->timeSat;
    s->pGlobalVars = (int *)0x0;
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (iVar1 == -1) {
      pManInterA = (Inta_Man_t *)sat_solver_store_release(s);
      Var = 1;
    }
    else if (iVar1 == 1) {
      Var = 0;
    }
    else {
      Var = -1;
    }
    sat_solver_delete(s);
    if (pManInterA == (Inta_Man_t *)0x0) {
      p_local._4_4_ = Var;
    }
    else {
      aVar2 = Abc_Clock();
      p_00 = Inta_ManAlloc();
      pAVar4 = (Aig_Man_t *)
               Inta_ManInterpolate(p_00,(Sto_Man_t *)pManInterA,nTimeNewOut,p->vVarsAB,0);
      p->pInterNew = pAVar4;
      Inta_ManFree(p_00);
      aVar3 = Abc_Clock();
      p->timeInt = (aVar3 - aVar2) + p->timeInt;
      Sto_ManFree((Sto_Man_t *)pManInterA);
      if (p->pInterNew == (Aig_Man_t *)0x0) {
        Var = -1;
      }
      p_local._4_4_ = Var;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Inter_ManPerformOneStep( Inter_Man_t * p, int fUseBias, int fUseBackward, abctime nTimeNewOut )
{
    sat_solver * pSat;
    void * pSatCnf = NULL;
    Inta_Man_t * pManInterA; 
//    Intb_Man_t * pManInterB; 
    int * pGlobalVars;
    int status, RetValue;
    int i, Var;
    abctime clk;
//    assert( p->pInterNew == NULL );

    // derive the SAT solver
    pSat = Inter_ManDeriveSatSolver( p->pInter, p->pCnfInter, p->pAigTrans, p->pCnfAig, p->pFrames, p->pCnfFrames, p->vVarsAB, fUseBackward );
    if ( pSat == NULL )
    {
        p->pInterNew = NULL;
        return 1;
    }

    // set runtime limit
    if ( nTimeNewOut )
        sat_solver_set_runtime_limit( pSat, nTimeNewOut );

    // collect global variables
    pGlobalVars = ABC_CALLOC( int, sat_solver_nvars(pSat) );
    Vec_IntForEachEntry( p->vVarsAB, Var, i )
        pGlobalVars[Var] = 1;
    pSat->pGlobalVars = fUseBias? pGlobalVars : NULL;

    // solve the problem
clk = Abc_Clock();
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)p->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    p->nConfCur = pSat->stats.conflicts;
p->timeSat += Abc_Clock() - clk;

    pSat->pGlobalVars = NULL;
    ABC_FREE( pGlobalVars );
    if ( status == l_False )
    {
        pSatCnf = sat_solver_store_release( pSat );
        RetValue = 1;
    }
    else if ( status == l_True )
    {
        RetValue = 0;
    } 
    else
    {
        RetValue = -1;
    }
    sat_solver_delete( pSat );
    if ( pSatCnf == NULL )
        return RetValue;

    // create the resulting manager
clk = Abc_Clock();
/*
    if ( !fUseIp )
    {
        pManInterA = Inta_ManAlloc();
        p->pInterNew = Inta_ManInterpolate( pManInterA, pSatCnf, p->vVarsAB, 0 );
        Inta_ManFree( pManInterA );
    }
    else
    {
        Aig_Man_t * pInterNew2;
        int RetValue;

        pManInterA = Inta_ManAlloc();
        p->pInterNew = Inta_ManInterpolate( pManInterA, pSatCnf, p->vVarsAB, 0 );
//        Inter_ManVerifyInterpolant1( pManInterA, pSatCnf, p->pInterNew );
        Inta_ManFree( pManInterA );

        pManInterB = Intb_ManAlloc();
        pInterNew2 = Intb_ManInterpolate( pManInterB, pSatCnf, p->vVarsAB, 0 );
        Inter_ManVerifyInterpolant2( pManInterB, pSatCnf, pInterNew2 );
        Intb_ManFree( pManInterB );

        // check relationship
        RetValue = Inter_ManCheckEquivalence( pInterNew2, p->pInterNew );
        if ( RetValue )
            printf( "Equivalence \"Ip == Im\" holds\n" );
        else
        {
//            printf( "Equivalence \"Ip == Im\" does not hold\n" );
            RetValue = Inter_ManCheckContainment( pInterNew2, p->pInterNew );
            if ( RetValue )
                printf( "Containment \"Ip -> Im\" holds\n" );
            else
                printf( "Containment \"Ip -> Im\" does not hold\n" );

            RetValue = Inter_ManCheckContainment( p->pInterNew, pInterNew2 );
            if ( RetValue )
                printf( "Containment \"Im -> Ip\" holds\n" );
            else
                printf( "Containment \"Im -> Ip\" does not hold\n" );
        }

        Aig_ManStop( pInterNew2 );
    }
*/

    pManInterA = Inta_ManAlloc();
    p->pInterNew = (Aig_Man_t *)Inta_ManInterpolate( pManInterA, (Sto_Man_t *)pSatCnf, nTimeNewOut, p->vVarsAB, 0 );
    Inta_ManFree( pManInterA );

p->timeInt += Abc_Clock() - clk;
    Sto_ManFree( (Sto_Man_t *)pSatCnf );
    if ( p->pInterNew == NULL )
        RetValue = -1;
    return RetValue;
}